

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

bool __thiscall toml::internal::Parser::parseKeyValue(Parser *this,Value *current)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Value *pVVar3;
  uint uVar4;
  Value v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  Value local_30;
  
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar4 = (this->token_).type_ - IDENT;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (uVar4 < 2) {
    std::__cxx11::string::_M_assign((string *)&local_50);
    nextValue(this);
    if (1 < uVar4) goto LAB_00136a8c;
    if ((this->token_).type_ == EQUAL) {
      nextValue(this);
      local_30.type_ = NULL_TYPE;
      local_30.field_1.null_ = (void *)0x0;
      bVar2 = parseValue(this,&local_30);
      if (((bVar2) && (uVar4 = (this->token_).type_ - END_OF_FILE, uVar4 < 2)) &&
         (nextKey(this), uVar4 < 2)) {
        pVVar3 = Value::find(current,&local_50);
        if (pVVar3 != (Value *)0x0) {
          std::operator+(&local_70,"Multiple same key: ",&local_50);
          addError(this,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00136a7e;
        }
        bVar2 = true;
        Value::setChild(current,&local_50,&local_30);
      }
      else {
LAB_00136a7e:
        bVar2 = false;
      }
      Value::~Value(&local_30);
      goto LAB_00136ad3;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"no equal?","");
    addError(this,&local_70);
  }
  else {
LAB_00136a8c:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"parse key failed","");
    addError(this,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_00136ad3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

inline bool Parser::parseKeyValue(Value* current)
{
    std::string key;
    if (!parseKey(&key)) {
        addError("parse key failed");
        return false;
    }
    if (!consumeForValue(TokenType::EQUAL)) {
        addError("no equal?");
        return false;
    }

    Value v;
    if (!parseValue(&v))
        return false;
    if (!consumeEOLorEOFForKey())
        return false;

    if (current->has(key)) {
        addError("Multiple same key: " + key);
        return false;
    }

    current->setChild(key, std::move(v));
    return true;
}